

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::UdpDeclarationSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,UdpDeclarationSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  SyntaxNode *node;
  UdpBodySyntax *node_00;
  SyntaxNode *local_70;
  size_t index_local;
  UdpDeclarationSyntax *this_local;
  
  switch(index) {
  case 0:
    local_70 = (SyntaxNode *)0x0;
    if (this != (UdpDeclarationSyntax *)0xfffffffffffffff0) {
      local_70 = &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode;
    }
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,local_70);
    break;
  case 1:
    token.kind = (this->primitive).kind;
    token._2_1_ = (this->primitive).field_0x2;
    token.numFlags.raw = (this->primitive).numFlags.raw;
    token.rawLen = (this->primitive).rawLen;
    token.info = (this->primitive).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 2:
    token_00.kind = (this->name).kind;
    token_00._2_1_ = (this->name).field_0x2;
    token_00.numFlags.raw = (this->name).numFlags.raw;
    token_00.rawLen = (this->name).rawLen;
    token_00.info = (this->name).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  case 3:
    node = &not_null<slang::syntax::UdpPortListSyntax_*>::get(&this->portList)->super_SyntaxNode;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,node);
    break;
  case 4:
    node_00 = not_null<slang::syntax::UdpBodySyntax_*>::get(&this->body);
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,&node_00->super_SyntaxNode);
    break;
  case 5:
    token_01.kind = (this->endprimitive).kind;
    token_01._2_1_ = (this->endprimitive).field_0x2;
    token_01.numFlags.raw = (this->endprimitive).numFlags.raw;
    token_01.rawLen = (this->endprimitive).rawLen;
    token_01.info = (this->endprimitive).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_01);
    break;
  case 6:
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,&this->endBlockName->super_SyntaxNode);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax UdpDeclarationSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return &attributes;
        case 1: return primitive;
        case 2: return name;
        case 3: return portList.get();
        case 4: return body.get();
        case 5: return endprimitive;
        case 6: return endBlockName;
        default: return nullptr;
    }
}